

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O2

char16 * __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryReadString
          (DeserializationCloner<Js::StreamReader> *this,charcount_t *len,bool reuseBuffer)

{
  size_t count;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  char16_t *pv;
  uint uVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  uint32 byteLen;
  
  bVar2 = ThreadContext::IsOnStack(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x1b1,"(ThreadContext::IsOnStack(this))",
                                "ThreadContext::IsOnStack(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  StreamReader::Read<unsigned_int>(this->m_reader,(uint *)&data.field_0x24);
  if (data._36_4_ == -1) {
    pv = (char16_t *)0x0;
  }
  else if (data._36_4_ == 0) {
    *len = 0;
    pv = L"";
  }
  else {
    uVar5 = (uint)data._36_4_ >> 1;
    if (reuseBuffer) {
      if (this->m_bufferLength < uVar5) {
        count = (ulong)uVar5 + 1;
        local_58 = (undefined1  [8])&char16_t::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_aa22bbf;
        data.filename._0_4_ = 0x1c9;
        data.plusSize = count;
        pRVar4 = Memory::Recycler::TrackAllocInfo
                           (((this->
                             super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                             ).super_ScriptContextHolder.m_scriptContext)->recycler,
                            (TrackAllocData *)local_58);
        pv = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
        this->m_buffer = pv;
        this->m_bufferLength = uVar5;
      }
      else {
        pv = this->m_buffer;
      }
    }
    else {
      local_58 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_aa22bbf;
      data.filename._0_4_ = 0x1d2;
      data.plusSize = (ulong)(uVar5 + 1);
      pRVar4 = Memory::Recycler::TrackAllocInfo
                         (((this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                           ).super_ScriptContextHolder.m_scriptContext)->recycler,
                          (TrackAllocData *)local_58);
      pv = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)(uVar5 + 1))
      ;
    }
    StreamReader::Read(this->m_reader,pv,(ulong)(uint)data._36_4_);
    pv[uVar5] = L'\0';
    *len = uVar5;
    if ((data._36_4_ & 3) != 0) {
      StreamReader::Read(this->m_reader,local_58,4 - ((ulong)(uint)data._36_4_ & 3));
    }
  }
  return pv;
}

Assistant:

const char16* DeserializationCloner<Reader>::TryReadString(charcount_t* len, bool reuseBuffer) const
    {
        // m_buffer is allocated on GC heap and stored in a regular field.
        // that is ok since 'this' is always a stack instance.
        Assert(ThreadContext::IsOnStack(this));

        uint32 byteLen;
        m_reader->Read(&byteLen);

        if (byteLen == SCA_PROPERTY_TERMINATOR)
        {
            return nullptr;
        }
        else if (byteLen == 0)
        {
            *len = 0;
            return _u("");
        }
        else
        {
            charcount_t newLen = byteLen / sizeof(char16);
            char16* buf;

            if (reuseBuffer)
            {
                if (this->m_bufferLength < newLen)
                {
                    Recycler* recycler = this->GetScriptContext()->GetRecycler();
                    this->m_buffer = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
                    this->m_bufferLength = newLen;
                }

                buf = this->m_buffer;
            }
            else
            {
                Recycler* recycler = this->GetScriptContext()->GetRecycler();
                buf = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
            }

            m_reader->Read(buf, byteLen);
            buf[newLen] = NULL;
            *len = newLen;

            uint32 unalignedLen = byteLen % sizeof(uint32);
            if (unalignedLen)
            {
                uint32 padding;
                m_reader->Read(&padding, sizeof(uint32) - unalignedLen);
            }

            return buf;
        }
    }